

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_move_to_first(nk_text_edit *state)

{
  nk_text_edit *in_RDI;
  
  if (in_RDI->select_start != in_RDI->select_end) {
    nk_textedit_sortselection(in_RDI);
    in_RDI->cursor = in_RDI->select_start;
    in_RDI->select_end = in_RDI->select_start;
    in_RDI->has_preferred_x = '\0';
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_move_to_first(struct nk_text_edit *state)
{
/* move cursor to first character of selection */
if (NK_TEXT_HAS_SELECTION(state)) {
nk_textedit_sortselection(state);
state->cursor = state->select_start;
state->select_end = state->select_start;
state->has_preferred_x = 0;
}
}